

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O3

void down2_symeven(uint8_t *input,int length,uint8_t *output,int start_offset)

{
  undefined4 uVar1;
  bool bVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  int iVar11;
  uint8_t uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  byte *pbVar22;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar10 = (ulong)(uint)start_offset;
  uVar15 = (length + (length & 1U)) - 4;
  if ((int)uVar15 < 4) {
    if (start_offset < length) {
      uVar10 = (ulong)start_offset;
      iVar11 = start_offset + 1;
      do {
        iVar13 = 0x40;
        lVar19 = 0;
        uVar14 = uVar10 & 0xffffffff;
        iVar21 = iVar11;
        do {
          uVar17 = 0;
          if (0 < (int)uVar14) {
            uVar17 = uVar14;
          }
          iVar18 = length + -1;
          if (iVar21 < length + -1) {
            iVar18 = iVar21;
          }
          iVar13 = iVar13 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar19) *
                            ((uint)input[iVar18] + (uint)input[uVar17]);
          iVar21 = iVar21 + 1;
          uVar14 = (ulong)((int)uVar14 - 1);
          lVar19 = lVar19 + 2;
        } while (lVar19 != 8);
        iVar13 = iVar13 >> 7;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        uVar12 = (uint8_t)iVar13;
        if (0xfe < iVar13) {
          uVar12 = 0xff;
        }
        *output = uVar12;
        output = output + 1;
        uVar10 = uVar10 + 2;
        iVar11 = iVar11 + 2;
      } while ((long)uVar10 < (long)length);
    }
  }
  else {
    if (start_offset < 4) {
      pbVar16 = input + (long)start_offset + 1;
      uVar14 = (long)start_offset;
      do {
        iVar11 = 0x40;
        lVar19 = 0;
        uVar10 = uVar14 & 0xffffffff;
        pbVar22 = pbVar16;
        do {
          uVar17 = 0;
          if (0 < (int)uVar10) {
            uVar17 = uVar10;
          }
          iVar11 = iVar11 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar19) *
                            ((uint)*pbVar22 + (uint)input[uVar17]);
          pbVar22 = pbVar22 + 1;
          uVar10 = (ulong)((int)uVar10 - 1);
          lVar19 = lVar19 + 2;
        } while (lVar19 != 8);
        iVar11 = iVar11 >> 7;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        uVar12 = (uint8_t)iVar11;
        if (0xfe < iVar11) {
          uVar12 = 0xff;
        }
        *output = uVar12;
        output = output + 1;
        uVar10 = uVar14 + 2;
        pbVar16 = pbVar16 + 2;
        bVar2 = (long)uVar14 < 2;
        uVar14 = uVar10;
      } while (bVar2);
    }
    auVar9 = _DAT_00556e80;
    auVar8 = _DAT_00513c80;
    if ((int)uVar10 < (int)uVar15) {
      uVar10 = (ulong)(int)uVar10;
      do {
        uVar1 = *(undefined4 *)(input + uVar10 + 1);
        uVar14 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar3._8_4_ = 0;
        auVar3._0_8_ = uVar14;
        auVar3[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar4[8] = (char)((uint)uVar1 >> 0x10);
        auVar4._0_8_ = uVar14;
        auVar4[9] = 0;
        auVar4._10_3_ = auVar3._10_3_;
        auVar6._5_8_ = 0;
        auVar6._0_5_ = auVar4._8_5_;
        auVar5[4] = (char)((uint)uVar1 >> 8);
        auVar5._0_4_ = (int)uVar14;
        auVar5[5] = 0;
        auVar5._6_7_ = SUB137(auVar6 << 0x40,6);
        uVar1 = *(undefined4 *)(input + (uVar10 - 3));
        uVar27 = (undefined1)((uint)uVar1 >> 0x18);
        uVar26 = (undefined1)((uint)uVar1 >> 0x10);
        uVar25 = (undefined1)((uint)uVar1 >> 8);
        uVar7 = CONCAT22(CONCAT11(uVar25,uVar25),CONCAT11((char)uVar1,(char)uVar1));
        auVar23._4_4_ =
             (undefined4)
             (CONCAT35(CONCAT21(CONCAT11(uVar27,uVar27),uVar26),CONCAT14(uVar26,uVar1)) >> 0x20);
        auVar23._0_4_ = uVar7;
        auVar23._8_4_ = uVar7;
        auVar23._12_4_ = 0;
        auVar23 = pshuflw(auVar23,auVar23,0xe7);
        auVar23 = pshufhw(auVar23,auVar23,0xc5);
        auVar23 = auVar23 & auVar8;
        auVar24._0_4_ = auVar23._0_4_ + (int)uVar14;
        auVar24._4_4_ = auVar23._4_4_ + auVar5._4_4_;
        auVar24._8_4_ = auVar23._8_4_ + auVar4._8_4_;
        auVar24._12_4_ = auVar23._12_4_ + (uint)(uint3)(auVar3._10_3_ >> 0x10);
        auVar23 = pmaddwd(auVar24,auVar9);
        iVar11 = auVar23._12_4_ + auVar23._4_4_ + auVar23._8_4_ + auVar23._0_4_ + 0x40 >> 7;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        *output = (uint8_t)iVar11;
        output = output + 1;
        uVar10 = uVar10 + 2;
      } while ((long)uVar10 < (long)(ulong)uVar15);
    }
    iVar11 = (int)uVar10;
    if (iVar11 < length) {
      lVar19 = (long)iVar11;
      iVar11 = iVar11 + 1;
      pbVar16 = input + lVar19;
      do {
        iVar13 = 0x40;
        lVar20 = 0;
        pbVar22 = pbVar16;
        iVar21 = iVar11;
        do {
          iVar18 = length + -1;
          if (iVar21 < length + -1) {
            iVar18 = iVar21;
          }
          iVar13 = iVar13 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar20) *
                            ((uint)input[iVar18] + (uint)*pbVar22);
          iVar21 = iVar21 + 1;
          pbVar22 = pbVar22 + -1;
          lVar20 = lVar20 + 2;
        } while (lVar20 != 8);
        iVar13 = iVar13 >> 7;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        uVar12 = (uint8_t)iVar13;
        if (0xfe < iVar13) {
          uVar12 = 0xff;
        }
        *output = uVar12;
        output = output + 1;
        lVar19 = lVar19 + 2;
        iVar11 = iVar11 + 2;
        pbVar16 = pbVar16 + 2;
      } while (lVar19 < length);
    }
  }
  return;
}

Assistant:

void down2_symeven(const uint8_t *const input, int length, uint8_t *output,
                   int start_offset) {
  // Actual filter len = 2 * filter_len_half.
  const int16_t *filter = av1_down2_symeven_half_filter;
  const int filter_len_half = sizeof(av1_down2_symeven_half_filter) / 2;
  int i, j;
  uint8_t *optr = output;
  int l1 = filter_len_half;
  int l2 = (length - filter_len_half);
  l1 += (l1 & 1);
  l2 += (l2 & 1);
  if (l1 > l2) {
    // Short input length.
    for (i = start_offset; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum +=
            (input[AOMMAX(i - j, 0)] + input[AOMMIN(i + 1 + j, length - 1)]) *
            filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
  } else {
    // Initial part.
    for (i = start_offset; i < l1; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum += (input[AOMMAX(i - j, 0)] + input[i + 1 + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
    // Middle part.
    for (; i < l2; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum += (input[i - j] + input[i + 1 + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
    // End part.
    for (; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum +=
            (input[i - j] + input[AOMMIN(i + 1 + j, length - 1)]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
  }
}